

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O3

void __thiscall
UnicodeFullTest_string_cast_Test<std::pair<char16_t,_char32_t>_>::TestBody
          (UnicodeFullTest_string_cast_Test<std::pair<char16_t,_char32_t>_> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
  *paVar1;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> lhs;
  bool bVar2;
  char32_t (*in_RDX) [5];
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *in_string;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> *extraout_RDX_00;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> *extraout_RDX_01;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> *extraout_RDX_02;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> *extraout_RDX_03;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> *in_string_00;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> *extraout_RDX_04;
  pointer *__ptr;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> rhs;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> rhs_00;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> lhs_00;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> abcd_str;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> abcd_string_view;
  AssertHelper aAStack_88 [8];
  long *local_80;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_78;
  byte local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_48;
  size_t local_28;
  char16_t *local_20;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> *extraout_RDX;
  
  jessilib::string_cast<char16_t,char32_t[5]>(&local_48,(jessilib *)L"ABCD",in_RDX);
  local_28 = local_48._M_string_length;
  local_20 = local_48._M_dataplus._M_p;
  jessilib::string_cast<char32_t,std::__cxx11::u16string>(&local_78,(jessilib *)&local_48,in_string)
  ;
  rhs._M_str = local_78._M_dataplus._M_p;
  rhs._M_len = local_78._M_string_length;
  lhs_00._M_str = local_48._M_dataplus._M_p;
  lhs_00._M_len = local_48._M_string_length;
  local_58[0] = jessilib::equals<char16_t,char32_t>(lhs_00,rhs);
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  paVar1 = &local_78.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_78._M_dataplus._M_p == paVar1) {
    in_string_00 = extraout_RDX;
    if ((bool)local_58[0]) goto LAB_002103ee;
  }
  else {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity * 4 + 4);
    in_string_00 = extraout_RDX_00;
    if ((local_58[0] & 1) != 0) goto LAB_002103ee;
  }
  testing::Message::Message((Message *)&local_80);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((AssertionResult *)&local_78,(char *)local_58,
             "equals(abcd_str, string_cast<typename TypeParam::second_type>(abcd_str))","false");
  testing::internal::AssertHelper::AssertHelper
            (aAStack_88,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
             ,0x9d,(char *)local_78._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=(aAStack_88,(Message *)&local_80);
  testing::internal::AssertHelper::~AssertHelper(aAStack_88);
  in_string_00 = extraout_RDX_01;
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    in_string_00 = extraout_RDX_02;
  }
  if (local_80 != (long *)0x0) {
    (**(code **)(*local_80 + 8))();
    in_string_00 = extraout_RDX_03;
  }
LAB_002103ee:
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
    in_string_00 = extraout_RDX_04;
  }
  lhs._M_str = local_20;
  lhs._M_len = local_28;
  jessilib::string_cast<char32_t,std::basic_string_view<char16_t,std::char_traits<char16_t>>>
            (&local_78,(jessilib *)&local_28,in_string_00);
  rhs_00._M_str = local_78._M_dataplus._M_p;
  rhs_00._M_len = local_78._M_string_length;
  bVar2 = jessilib::equals<char16_t,char32_t>(lhs,rhs_00);
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_58[0] = bVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity * 4 + 4);
  }
  if (!bVar2) {
    testing::Message::Message((Message *)&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_78,(char *)local_58,
               "equals(abcd_string_view, string_cast<typename TypeParam::second_type>(abcd_string_view))"
               ,"false");
    testing::internal::AssertHelper::AssertHelper
              (aAStack_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xa1,(char *)local_78._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(aAStack_88,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(aAStack_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if (local_80 != (long *)0x0) {
      (**(code **)(*local_80 + 8))();
    }
    if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_50,local_50);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity * 2 + 2);
  }
  return;
}

Assistant:

TYPED_TEST(UnicodeFullTest, string_cast) {
	auto abcd_str = jessilib::string_cast<typename TypeParam::first_type>(U"ABCD");
	std::basic_string_view<typename TypeParam::first_type> abcd_string_view = abcd_str;

	EXPECT_TRUE(equals(abcd_str,
		string_cast<typename TypeParam::second_type>(abcd_str)));
	EXPECT_TRUE(is_valid(abcd_str));

	EXPECT_TRUE(equals(abcd_string_view,
		string_cast<typename TypeParam::second_type>(abcd_string_view)));
	EXPECT_TRUE(is_valid(abcd_string_view));
}